

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

string * __thiscall
libcellml::Variable::interfaceType_abi_cxx11_(string *__return_storage_ptr__,Variable *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)
             (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl[7].mId.field_2.
             _M_local_buf);
  return __return_storage_ptr__;
}

Assistant:

std::string Variable::interfaceType() const
{
    return pFunc()->mInterfaceType;
}